

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

faup_options_t * faup_options_new(void)

{
  faup_options_t *opts;
  
  opts = (faup_options_t *)malloc(0x58);
  if (opts != (faup_options_t *)0x0) {
    faup_options_defaults(opts);
  }
  return opts;
}

Assistant:

faup_options_t *faup_options_new(void)
{
	faup_options_t *opts;

	opts = malloc(sizeof(faup_options_t));
	if (!opts) {
		return NULL;
	}

	faup_options_defaults(opts);

	return opts;
}